

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

int vorbis_analysis_headerout
              (vorbis_dsp_state *v,vorbis_comment *vc,ogg_packet *op,ogg_packet *op_comm,
              ogg_packet *op_code)

{
  undefined8 uVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  long lVar5;
  void *local_78;
  private_state *b;
  oggpack_buffer opb;
  vorbis_info *vi;
  int ret;
  ogg_packet *op_code_local;
  ogg_packet *op_comm_local;
  ogg_packet *op_local;
  vorbis_comment *vc_local;
  vorbis_dsp_state *v_local;
  
  vi._4_4_ = -0x82;
  opb.storage = (long)v->vi;
  local_78 = v->backend_state;
  if (((local_78 == (void *)0x0) || (((vorbis_info *)opb.storage)->channels < 1)) ||
     (0x100 < ((vorbis_info *)opb.storage)->channels)) {
    local_78 = (void *)0x0;
    vi._4_4_ = -0x81;
  }
  else {
    oggpack_writeinit((oggpack_buffer *)&b);
    iVar2 = _vorbis_pack_info((oggpack_buffer *)&b,(vorbis_info *)opb.storage);
    if (iVar2 == 0) {
      if (*(long *)((long)local_78 + 0x78) != 0) {
        free(*(void **)((long)local_78 + 0x78));
      }
      sVar3 = oggpack_bytes((oggpack_buffer *)&b);
      pvVar4 = malloc(sVar3);
      uVar1 = opb._8_8_;
      *(void **)((long)local_78 + 0x78) = pvVar4;
      pvVar4 = *(void **)((long)local_78 + 0x78);
      sVar3 = oggpack_bytes((oggpack_buffer *)&b);
      memcpy(pvVar4,(void *)uVar1,sVar3);
      op->packet = *(uchar **)((long)local_78 + 0x78);
      lVar5 = oggpack_bytes((oggpack_buffer *)&b);
      op->bytes = lVar5;
      op->b_o_s = 1;
      op->e_o_s = 0;
      op->granulepos = 0;
      op->packetno = 0;
      oggpack_reset((oggpack_buffer *)&b);
      iVar2 = _vorbis_pack_comment((oggpack_buffer *)&b,vc);
      if (iVar2 == 0) {
        if (*(long *)((long)local_78 + 0x80) != 0) {
          free(*(void **)((long)local_78 + 0x80));
        }
        sVar3 = oggpack_bytes((oggpack_buffer *)&b);
        pvVar4 = malloc(sVar3);
        uVar1 = opb._8_8_;
        *(void **)((long)local_78 + 0x80) = pvVar4;
        pvVar4 = *(void **)((long)local_78 + 0x80);
        sVar3 = oggpack_bytes((oggpack_buffer *)&b);
        memcpy(pvVar4,(void *)uVar1,sVar3);
        op_comm->packet = *(uchar **)((long)local_78 + 0x80);
        lVar5 = oggpack_bytes((oggpack_buffer *)&b);
        op_comm->bytes = lVar5;
        op_comm->b_o_s = 0;
        op_comm->e_o_s = 0;
        op_comm->granulepos = 0;
        op_comm->packetno = 1;
        oggpack_reset((oggpack_buffer *)&b);
        iVar2 = _vorbis_pack_books((oggpack_buffer *)&b,(vorbis_info *)opb.storage);
        if (iVar2 == 0) {
          if (*(long *)((long)local_78 + 0x88) != 0) {
            free(*(void **)((long)local_78 + 0x88));
          }
          sVar3 = oggpack_bytes((oggpack_buffer *)&b);
          pvVar4 = malloc(sVar3);
          *(void **)((long)local_78 + 0x88) = pvVar4;
          pvVar4 = *(void **)((long)local_78 + 0x88);
          sVar3 = oggpack_bytes((oggpack_buffer *)&b);
          memcpy(pvVar4,(void *)opb._8_8_,sVar3);
          op_code->packet = *(uchar **)((long)local_78 + 0x88);
          lVar5 = oggpack_bytes((oggpack_buffer *)&b);
          op_code->bytes = lVar5;
          op_code->b_o_s = 0;
          op_code->e_o_s = 0;
          op_code->granulepos = 0;
          op_code->packetno = 2;
          oggpack_writeclear((oggpack_buffer *)&b);
          return 0;
        }
      }
    }
  }
  memset(op,0,0x30);
  memset(op_comm,0,0x30);
  memset(op_code,0,0x30);
  if (local_78 != (void *)0x0) {
    if (0 < *(int *)(opb.storage + 4)) {
      oggpack_writeclear((oggpack_buffer *)&b);
    }
    if (*(long *)((long)local_78 + 0x78) != 0) {
      free(*(void **)((long)local_78 + 0x78));
    }
    if (*(long *)((long)local_78 + 0x80) != 0) {
      free(*(void **)((long)local_78 + 0x80));
    }
    if (*(long *)((long)local_78 + 0x88) != 0) {
      free(*(void **)((long)local_78 + 0x88));
    }
    *(undefined8 *)((long)local_78 + 0x78) = 0;
    *(undefined8 *)((long)local_78 + 0x80) = 0;
    *(undefined8 *)((long)local_78 + 0x88) = 0;
  }
  return vi._4_4_;
}

Assistant:

int vorbis_analysis_headerout(vorbis_dsp_state *v,
                              vorbis_comment *vc,
                              ogg_packet *op,
                              ogg_packet *op_comm,
                              ogg_packet *op_code){
  int ret=OV_EIMPL;
  vorbis_info *vi=v->vi;
  oggpack_buffer opb;
  private_state *b=v->backend_state;

  if(!b||vi->channels<=0||vi->channels>256){
    b = NULL;
    ret=OV_EFAULT;
    goto err_out;
  }

  /* first header packet **********************************************/

  oggpack_writeinit(&opb);
  if(_vorbis_pack_info(&opb,vi))goto err_out;

  /* build the packet */
  if(b->header)_ogg_free(b->header);
  b->header=_ogg_malloc(oggpack_bytes(&opb));
  memcpy(b->header,opb.buffer,oggpack_bytes(&opb));
  op->packet=b->header;
  op->bytes=oggpack_bytes(&opb);
  op->b_o_s=1;
  op->e_o_s=0;
  op->granulepos=0;
  op->packetno=0;

  /* second header packet (comments) **********************************/

  oggpack_reset(&opb);
  if(_vorbis_pack_comment(&opb,vc))goto err_out;

  if(b->header1)_ogg_free(b->header1);
  b->header1=_ogg_malloc(oggpack_bytes(&opb));
  memcpy(b->header1,opb.buffer,oggpack_bytes(&opb));
  op_comm->packet=b->header1;
  op_comm->bytes=oggpack_bytes(&opb);
  op_comm->b_o_s=0;
  op_comm->e_o_s=0;
  op_comm->granulepos=0;
  op_comm->packetno=1;

  /* third header packet (modes/codebooks) ****************************/

  oggpack_reset(&opb);
  if(_vorbis_pack_books(&opb,vi))goto err_out;

  if(b->header2)_ogg_free(b->header2);
  b->header2=_ogg_malloc(oggpack_bytes(&opb));
  memcpy(b->header2,opb.buffer,oggpack_bytes(&opb));
  op_code->packet=b->header2;
  op_code->bytes=oggpack_bytes(&opb);
  op_code->b_o_s=0;
  op_code->e_o_s=0;
  op_code->granulepos=0;
  op_code->packetno=2;

  oggpack_writeclear(&opb);
  return(0);
 err_out:
  memset(op,0,sizeof(*op));
  memset(op_comm,0,sizeof(*op_comm));
  memset(op_code,0,sizeof(*op_code));

  if(b){
    if(vi->channels>0)oggpack_writeclear(&opb);
    if(b->header)_ogg_free(b->header);
    if(b->header1)_ogg_free(b->header1);
    if(b->header2)_ogg_free(b->header2);
    b->header=NULL;
    b->header1=NULL;
    b->header2=NULL;
  }
  return(ret);
}